

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

size_t ReadDataFromDisk(FILE *file,char *buf,size_t len)

{
  int iVar1;
  ostream *poVar2;
  size_t in_RDX;
  void *in_RSI;
  FILE *in_RDI;
  size_t ret;
  Logger *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde4;
  string *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  LogSeverity severity;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [36];
  Logger local_134;
  size_t local_130;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  Logger local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  Logger local_24;
  size_t local_20;
  void *local_18;
  FILE *local_10;
  size_t local_8;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  if (in_RDI == (FILE *)0x0) {
    Logger::Logger(&local_24,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"ReadDataFromDisk",&local_81);
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                           in_stack_fffffffffffffdd8);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd0);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"file");
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger(in_stack_fffffffffffffd70);
    abort();
  }
  if (in_RSI != (void *)0x0) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = feof(in_RDI);
    if (iVar1 == 0) {
      local_130 = fread(local_18,1,local_20,local_10);
      if (local_20 < local_130) {
        Logger::Logger(&local_134,FATAL);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_158,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                   ,&local_159);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,"ReadDataFromDisk",&local_181);
        poVar2 = Logger::Start(severity,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                               in_stack_fffffffffffffdd8);
        std::operator<<(poVar2,"Error: invoke fread().");
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        Logger::~Logger(in_stack_fffffffffffffd70);
      }
      local_8 = local_130;
    }
    else {
      local_8 = 0;
    }
    return local_8;
  }
  Logger::Logger(&local_88,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
             ,&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"ReadDataFromDisk",&local_d1);
  poVar2 = Logger::Start(severity,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                         in_stack_fffffffffffffdd8);
  poVar2 = std::operator<<(poVar2,"CHECK failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"buf");
  std::operator<<(poVar2," == NULL \n");
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  Logger::~Logger(in_stack_fffffffffffffd70);
  abort();
}

Assistant:

inline size_t ReadDataFromDisk(FILE *file, char *buf, size_t len) {
  CHECK_NOTNULL(file);
  CHECK_NOTNULL(buf);
  CHECK_GE(len, 0);
  // Reach the end of the file
  if (feof(file)) {
    return 0;
  }
  size_t ret = fread(buf, 1, len, file);
  if (ret > len) {
    LOG(FATAL) << "Error: invoke fread().";
  }
  return ret;
}